

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O3

int yaml_emitter_close(yaml_emitter_t *emitter)

{
  int iVar1;
  int iVar2;
  yaml_event_t local_78;
  
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                  ,0x5b,"int yaml_emitter_close(yaml_emitter_t *)");
  }
  if (emitter->opened != 0) {
    iVar2 = 1;
    if (emitter->closed == 0) {
      local_78.data.document_start.version_directive = (yaml_version_directive_t *)0x0;
      local_78.data.scalar.length = 0;
      local_78.data._32_8_ = 0;
      local_78.data.document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      local_78.data.document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      local_78.data._40_8_ = 0;
      local_78.type = YAML_STREAM_END_EVENT;
      local_78._4_4_ = 0;
      local_78.start_mark.index = 0;
      local_78.start_mark.line = 0;
      local_78.start_mark.column = 0;
      local_78.end_mark.index = 0;
      local_78.end_mark.line = 0;
      local_78.end_mark.column = 0;
      iVar1 = yaml_emitter_emit(emitter,&local_78);
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      else {
        emitter->closed = 1;
      }
    }
    return iVar2;
  }
  __assert_fail("emitter->opened",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                ,0x5c,"int yaml_emitter_close(yaml_emitter_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_close(yaml_emitter_t *emitter)
{
    yaml_event_t event;
    yaml_mark_t mark = { 0, 0, 0 };

    assert(emitter);            /* Non-NULL emitter object is required. */
    assert(emitter->opened);    /* Emitter should be opened. */

    if (emitter->closed) return 1;

    STREAM_END_EVENT_INIT(event, mark, mark);

    if (!yaml_emitter_emit(emitter, &event)) {
        return 0;
    }

    emitter->closed = 1;

    return 1;
}